

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headerssync.cpp
# Opt level: O1

bool __thiscall
HeadersSyncState::ValidateAndProcessSingleHeader(HeadersSyncState *this,CBlockHeader *current)

{
  bool bVar1;
  uint64_t uVar2;
  size_type sVar3;
  Logger *pLVar4;
  ulong uVar5;
  CBlockHeader *pCVar6;
  int source_line;
  char *flag;
  int i;
  long lVar7;
  long in_FS_OFFSET;
  byte bVar8;
  string_view source_file;
  string_view logging_function;
  long *in_stack_ffffffffffffff08;
  undefined4 uStack_f0;
  int next_height;
  CBlockIndex local_e8;
  arith_uint256 local_48;
  long local_28;
  
  bVar8 = 0;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_download_state == PRESYNC) {
    next_height = (int)this->m_current_height + 1;
    bVar1 = PermittedDifficultyTransition
                      (this->m_consensus_params,(long)next_height,
                       (this->m_last_header_received).nBits,current->nBits);
    if (bVar1) {
      if ((ulong)(long)next_height % 0x267 == (ulong)this->m_commit_offset) {
        CBlockHeader::GetHash((uint256 *)&local_e8,current);
        uVar2 = SipHashUint256((this->m_hasher).k0,(this->m_hasher).k1,(uint256 *)&local_e8);
        bitdeque<32768>::push_back(&this->m_header_commitments,(bool)((byte)uVar2 & 1));
        sVar3 = bitdeque<32768>::size(&this->m_header_commitments);
        if (this->m_max_commitments < sVar3) {
          pLVar4 = LogInstance();
          bVar1 = BCLog::Logger::WillLogCategoryLevel(pLVar4,NET,Debug);
          if (bVar1) {
            flag = 
            "Initial headers sync aborted with peer=%d: exceeded max commitments at height=%i (presync phase)\n"
            ;
            source_line = 0xcc;
            goto LAB_0087cc12;
          }
          goto LAB_0087caaa;
        }
      }
      lVar7 = 0;
      local_e8.m_chain_tx_count = 0;
      local_e8.nStatus = 0;
      local_e8.phashBlock = (uint256 *)0x0;
      local_e8.pprev = (CBlockIndex *)0x0;
      local_e8.pskip = (CBlockIndex *)0x0;
      local_e8.nHeight = 0;
      local_e8.nFile = 0;
      local_e8.nDataPos = 0;
      local_e8.nUndoPos = 0;
      local_e8.nChainWork.super_base_uint<256U>.pn[0] = 0;
      local_e8.nChainWork.super_base_uint<256U>.pn[1] = 0;
      local_e8.nChainWork.super_base_uint<256U>.pn[2] = 0;
      local_e8.nChainWork.super_base_uint<256U>.pn[3] = 0;
      local_e8.nChainWork.super_base_uint<256U>.pn[4] = 0;
      local_e8.nChainWork.super_base_uint<256U>.pn[5] = 0;
      local_e8.nChainWork.super_base_uint<256U>.pn[6] = 0;
      local_e8.nChainWork.super_base_uint<256U>.pn[7] = 0;
      local_e8.nTx = 0;
      local_e8.nVersion = current->nVersion;
      local_e8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._0_8_ =
           *(undefined8 *)(current->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems;
      local_e8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._8_8_ =
           *(undefined8 *)((current->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 8);
      local_e8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._16_8_ =
           *(undefined8 *)((current->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 0x10);
      local_e8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._24_8_ =
           *(undefined8 *)((current->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 0x18);
      local_e8.nTime = current->nTime;
      local_e8.nBits = current->nBits;
      local_e8.nNonce = current->nNonce;
      local_e8.nSequenceId = 0;
      local_e8.nTimeMax = 0;
      GetBlockProof(&local_48,&local_e8);
      uVar5 = 0;
      do {
        uVar5 = (ulong)local_48.super_base_uint<256U>.pn[lVar7] +
                (this->m_current_chain_work).super_base_uint<256U>.pn[lVar7] + uVar5;
        (this->m_current_chain_work).super_base_uint<256U>.pn[lVar7] = (uint32_t)uVar5;
        uVar5 = uVar5 >> 0x20;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 8);
      pCVar6 = &this->m_last_header_received;
      for (lVar7 = 0x14; lVar7 != 0; lVar7 = lVar7 + -1) {
        pCVar6->nVersion = current->nVersion;
        current = (CBlockHeader *)((long)current + (ulong)bVar8 * -8 + 4);
        pCVar6 = (CBlockHeader *)((long)pCVar6 + (ulong)bVar8 * -8 + 4);
      }
      this->m_current_height = (long)next_height;
      bVar1 = true;
      goto LAB_0087caac;
    }
    pLVar4 = LogInstance();
    bVar1 = BCLog::Logger::WillLogCategoryLevel(pLVar4,NET,Debug);
    if (bVar1) {
      flag = 
      "Initial headers sync aborted with peer=%d: invalid difficulty transition at height=%i (presync phase)\n"
      ;
      source_line = 0xc0;
LAB_0087cc12:
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/headerssync.cpp"
      ;
      source_file._M_len = 0x58;
      logging_function._M_str = "ValidateAndProcessSingleHeader";
      logging_function._M_len = 0x1e;
      LogPrintf_<long,int>
                (logging_function,source_file,source_line,(LogFlags)flag,(int)this + 8,
                 (char *)&next_height,in_stack_ffffffffffffff08,
                 (int *)CONCAT44(next_height,uStack_f0));
    }
  }
LAB_0087caaa:
  bVar1 = false;
LAB_0087caac:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool HeadersSyncState::ValidateAndProcessSingleHeader(const CBlockHeader& current)
{
    Assume(m_download_state == State::PRESYNC);
    if (m_download_state != State::PRESYNC) return false;

    int next_height = m_current_height + 1;

    // Verify that the difficulty isn't growing too fast; an adversary with
    // limited hashing capability has a greater chance of producing a high
    // work chain if they compress the work into as few blocks as possible,
    // so don't let anyone give a chain that would violate the difficulty
    // adjustment maximum.
    if (!PermittedDifficultyTransition(m_consensus_params, next_height,
                m_last_header_received.nBits, current.nBits)) {
        LogDebug(BCLog::NET, "Initial headers sync aborted with peer=%d: invalid difficulty transition at height=%i (presync phase)\n", m_id, next_height);
        return false;
    }

    if (next_height % HEADER_COMMITMENT_PERIOD == m_commit_offset) {
        // Add a commitment.
        m_header_commitments.push_back(m_hasher(current.GetHash()) & 1);
        if (m_header_commitments.size() > m_max_commitments) {
            // The peer's chain is too long; give up.
            // It's possible the chain grew since we started the sync; so
            // potentially we could succeed in syncing the peer's chain if we
            // try again later.
            LogDebug(BCLog::NET, "Initial headers sync aborted with peer=%d: exceeded max commitments at height=%i (presync phase)\n", m_id, next_height);
            return false;
        }
    }

    m_current_chain_work += GetBlockProof(CBlockIndex(current));
    m_last_header_received = current;
    m_current_height = next_height;

    return true;
}